

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::render(OSDText *this)

{
  bool bVar1;
  reference pOVar2;
  OSDLine local_68;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_20;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_18;
  iterator it;
  OSDText *this_local;
  
  it._M_current = (OSDLine *)this;
  (*__glewUseProgram)(this->program);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  local_18._M_current =
       (OSDLine *)
       std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::begin(&this->lines);
  while( true ) {
    local_20._M_current =
         (OSDLine *)
         std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::end(&this->lines);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pOVar2 = __gnu_cxx::
             __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
             ::operator*(&local_18);
    OSDLine::OSDLine(&local_68,pOVar2);
    draw_line(this,&local_68);
    OSDLine::~OSDLine(&local_68);
    __gnu_cxx::
    __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
    ::operator++(&local_18);
  }
  (*__glewUseProgram)(0);
  return;
}

Assistant:

void OSDText::render() {

  glUseProgram(program);

  glEnable( GL_BLEND );
  glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    draw_line(*it);
    ++it;
  }

  glUseProgram(0);
}